

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O0

uint32_t __thiscall jrtplib::RTPPacketBuilder::CreateNewSSRC(RTPPacketBuilder *this)

{
  uint32_t uVar1;
  int iVar2;
  RTPPacketBuilder *this_local;
  
  uVar1 = (*this->rtprnd->_vptr_RTPRandom[4])();
  this->ssrc = uVar1;
  uVar1 = (*this->rtprnd->_vptr_RTPRandom[4])();
  this->timestamp = uVar1;
  iVar2 = (*this->rtprnd->_vptr_RTPRandom[3])();
  this->seqnr = (uint16_t)iVar2;
  this->numpayloadbytes = 0;
  this->numpackets = 0;
  return this->ssrc;
}

Assistant:

uint32_t RTPPacketBuilder::CreateNewSSRC()
{
	ssrc = rtprnd.GetRandom32();
	timestamp = rtprnd.GetRandom32();
	seqnr = rtprnd.GetRandom16();

	// p 38: the count SHOULD be reset if the sender changes its SSRC identifier
	numpayloadbytes = 0;
	numpackets = 0;
	return ssrc;
}